

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O1

int fy_parse_input_done(fy_parser *fyp)

{
  fy_input_type fVar1;
  fy_input *fyi;
  void *pvVar2;
  int iVar3;
  
  iVar3 = -1;
  if (fyp != (fy_parser *)0x0) {
    fyi = fyp->current_input;
    if (fyi == (fy_input *)0x0) {
      iVar3 = 0;
    }
    else {
      fVar1 = (fyi->cfg).type;
      if ((fVar1 == fyit_stream) ||
         ((fVar1 == fyit_file && ((fyi->field_11).file.addr == (void *)0x0)))) {
        pvVar2 = realloc(fyi->buffer,fyp->current_input_pos);
        if ((pvVar2 == (void *)0x0) && (fyp->current_input_pos != 0)) {
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                         ,0x1ae,"fy_parse_input_done","realloc() failed");
          return -1;
        }
        fyi->buffer = pvVar2;
        fyi->allocated = fyp->current_input_pos;
      }
      iVar3 = 0;
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                     ,0x1b8,"fy_parse_input_done","moving current input to parsed inputs");
      fyi->state = FYIS_PARSED;
      fy_input_unref(fyi);
      fyp->current_input = (fy_input *)0x0;
    }
  }
  return iVar3;
}

Assistant:

int fy_parse_input_done(struct fy_parser *fyp) {
    struct fy_input *fyi;
    void *buf;

    if (!fyp)
        return -1;

    fyi = fyp->current_input;
    if (!fyi)
        return 0;

    switch (fyi->cfg.type) {
        case fyit_file:
            if (fyi->file.addr)
                break;

            /* fall-through */

        case fyit_stream:
            fyp_error_check(fyp, fyp, err_out,
                            "no parser associated with input");
            /* chop extra buffer */
            buf = realloc(fyi->buffer, fyp->current_input_pos);
            fyp_error_check(fyp, buf || !fyp->current_input_pos, err_out,
                            "realloc() failed");

            fyi->buffer = buf;
            fyi->allocated = fyp->current_input_pos;
            break;
        default:
            break;

    }

    fyp_scan_debug(fyp, "moving current input to parsed inputs");

    fyi->state = FYIS_PARSED;
    fy_input_unref(fyi);

    fyp->current_input = NULL;

    return 0;

    err_out:
    return -1;
}